

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O3

bool __thiscall
PsxRelocator::relocateFile(PsxRelocator *this,PsxRelocatorFile *file,int *relocationAddress)

{
  int iVar1;
  pointer pPVar2;
  size_t sVar3;
  pointer pPVar4;
  element_type *peVar5;
  pointer pPVar6;
  pointer pcVar7;
  pointer pbVar8;
  RelocationAction *action;
  mapped_type_conflict1 *pmVar9;
  uint uVar10;
  PsxRelocatorFile *pPVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  string *error;
  pointer pbVar15;
  int *__k;
  pointer pPVar16;
  pointer pPVar17;
  PsxSegment *seg;
  PsxRelocation *rel;
  pointer pPVar18;
  pointer pPVar19;
  string_view text;
  string_view text_00;
  vector<RelocationAction,_std::allocator<RelocationAction>_> relocationActions;
  ByteArray sectionData;
  int index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> relocationOffsets;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> symbolOffsets;
  undefined1 local_108 [32];
  pointer local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  pPVar11 = (PsxRelocatorFile *)0x0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar1 = *relocationAddress;
  pPVar17 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar2 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pPVar17 != pPVar2) {
    iVar12 = iVar1;
    do {
      local_d8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_d8[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,pPVar17->id);
      sVar3 = (pPVar17->data).size_;
      pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_90,(key_type_conflict *)local_d8);
      *pmVar9 = iVar12;
      iVar12 = (int)sVar3 + *relocationAddress;
      iVar12 = (-iVar12 & 3U) + iVar12;
      *relocationAddress = iVar12;
      pPVar17 = pPVar17 + 1;
    } while (pPVar17 != pPVar2);
  }
  pPVar16 = (file->symbols).super__Vector_base<PsxSymbol,_std::allocator<PsxSymbol>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar4 = (file->symbols).super__Vector_base<PsxSymbol,_std::allocator<PsxSymbol>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar16 == pPVar4) {
    bVar14 = false;
  }
  else {
    bVar14 = false;
    __k = &pPVar16->segment;
    do {
      switch(((PsxSymbol *)(__k + -10))->type) {
      case Internal:
      case Function:
        peVar5 = (((shared_ptr<Label> *)(__k + 4))->
                 super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_90,__k);
        pPVar11 = (PsxRelocatorFile *)((long)__k[1] + (long)*pmVar9);
        peVar5->value = (int64_t)pPVar11;
        ((((shared_ptr<Label> *)(__k + 4))->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->defined = true;
        break;
      case InternalID:
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_90,__k);
        lVar13 = (long)__k[1] + (long)*pmVar9;
        peVar5 = (((shared_ptr<Label> *)(__k + 4))->
                 super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        peVar5->value = lVar13;
        peVar5->defined = true;
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,__k + 2);
LAB_0016b87d:
        *pmVar9 = (mapped_type_conflict1)lVar13;
        break;
      case External:
        peVar5 = (((shared_ptr<Label> *)(__k + 4))->
                 super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar5->defined != false) {
          lVar13 = peVar5->value;
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_60,__k + 2);
          goto LAB_0016b87d;
        }
        bVar14 = true;
        pPVar11 = file;
        Logger::queueError<std::__cxx11::string,std::__cxx11::string>
                  (Error,"Undefined external symbol %s in file %s",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__k + -8),
                   &file->name);
        break;
      case BSS:
        peVar5 = (((shared_ptr<Label> *)(__k + 4))->
                 super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        iVar12 = *relocationAddress;
        peVar5->value = (long)iVar12;
        peVar5->defined = true;
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,__k + 2);
        *pmVar9 = iVar12;
        uVar10 = (-(*relocationAddress + __k[3]) & 3U) + *relocationAddress + __k[3];
        pPVar11 = (PsxRelocatorFile *)(ulong)uVar10;
        *relocationAddress = uVar10;
      }
      pPVar16 = (pointer)(__k + 8);
      __k = __k + 0x12;
    } while (pPVar16 != pPVar4);
    if (bVar14) {
      bVar14 = false;
      goto LAB_0016bb3d;
    }
  }
  sVar3 = (this->outputData).size_;
  ByteArray::reserveBytes(&this->outputData,(long)*relocationAddress - (long)iVar1,'\0');
  pPVar17 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar2 = (file->segments).super__Vector_base<PsxSegment,_std::allocator<PsxSegment>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar17 == pPVar2) {
    bVar14 = true;
  }
  else {
    do {
      ByteArray::ByteArray((ByteArray *)(local_108 + 0x18),&pPVar17->data);
      local_108._0_8_ = (PsxRelocatorFile *)0x0;
      local_108._8_8_ = (PsxRelocatorFile *)0x0;
      local_108._16_8_ = 0;
      pPVar6 = (pPVar17->relocations).
               super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pPVar18 = (pPVar17->relocations).
                     super__Vector_base<PsxRelocation,_std::allocator<PsxRelocation>_>._M_impl.
                     super__Vector_impl_data._M_start; pPVar18 != pPVar6; pPVar18 = pPVar18 + 1) {
        local_d8[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)pPVar18->segmentOffset;
        pPVar11 = (PsxRelocatorFile *)0xffffffff;
        if ((pointer)((long)&(((pointer)
                              local_d8[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                     3U) < local_e8) {
          pPVar11 = (PsxRelocatorFile *)
                    (ulong)*(uint *)((long)&(((pointer)
                                             local_d8[0].
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->name).
                                            _M_dataplus._M_p + local_108._24_8_);
        }
        local_d8[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(local_d8[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(int)pPVar11
                              );
        if (pPVar18->refType == SymblId) {
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_60,&pPVar18->referenceId);
          uVar10 = pPVar18->relativeOffset + *pmVar9;
LAB_0016b9a9:
          pPVar11 = (PsxRelocatorFile *)(ulong)uVar10;
          local_d8[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(long)(int)uVar10;
        }
        else if (pPVar18->refType == SegmentOffset) {
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_90,&pPVar18->referenceId);
          uVar10 = pPVar18->referencePos + *pmVar9 + pPVar18->relativeOffset;
          goto LAB_0016b9a9;
        }
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((ulong)pPVar18->type < 4) {
          pPVar11 = (PsxRelocatorFile *)local_108;
          iVar12 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[4])
                             (this->reloc,(ulong)*(uint *)(&DAT_00190030 + (ulong)pPVar18->type * 4)
                              ,local_d8,pPVar11,&local_a8);
          pbVar8 = local_a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar15 = local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((char)iVar12 == '\0') {
            for (; pbVar15 != pbVar8; pbVar15 = pbVar15 + 1) {
              text._M_str = (char *)pPVar11;
              text._M_len = (size_t)(pbVar15->_M_dataplus)._M_p;
              Logger::queueError((Logger *)0x1,(ErrorType)pbVar15->_M_string_length,text);
            }
            bVar14 = true;
          }
        }
        else {
          bVar14 = true;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
      }
      local_d8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar12 = (*(this->reloc->super_IElfRelocator)._vptr_IElfRelocator[5])
                         (this->reloc,local_108,local_d8);
      pbVar8 = local_d8[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((char)iVar12 == '\0') {
        bVar14 = true;
        for (pPVar19 = (pointer)local_d8[0].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
            pPVar19 != (pointer)pbVar8; pPVar19 = (pointer)&pPVar19->id) {
          text_00._M_str = (char *)pPVar11;
          text_00._M_len = (size_t)(pPVar19->name)._M_dataplus._M_p;
          Logger::queueError((Logger *)0x1,(ErrorType)(pPVar19->name)._M_string_length,text_00);
        }
      }
      for (pPVar11 = (PsxRelocatorFile *)local_108._0_8_;
          pPVar11 != (PsxRelocatorFile *)local_108._8_8_;
          pPVar11 = (PsxRelocatorFile *)&(pPVar11->name).field_2) {
        pcVar7 = (pPVar11->name)._M_dataplus._M_p;
        if ((pointer)(pcVar7 + 3) < local_e8) {
          *(int *)(pcVar7 + local_108._24_8_) = (int)(pPVar11->name)._M_string_length;
        }
      }
      pPVar11 = (PsxRelocatorFile *)local_108._8_8_;
      pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_90,&pPVar17->id);
      memcpy((this->outputData).data_ + (long)*pmVar9 + (sVar3 - (long)iVar1),
             (void *)local_108._24_8_,(size_t)local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_d8);
      if ((PsxRelocatorFile *)local_108._0_8_ != (PsxRelocatorFile *)0x0) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
      }
      ByteArray::~ByteArray((ByteArray *)(local_108 + 0x18));
      pPVar17 = pPVar17 + 1;
    } while (pPVar17 != pPVar2);
    bVar14 = (bool)(bVar14 ^ 1);
  }
LAB_0016bb3d:
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_90);
  return bVar14;
}

Assistant:

bool PsxRelocator::relocateFile(PsxRelocatorFile& file, int& relocationAddress)
{
	std::map<int,int> relocationOffsets;
	std::map<int,int> symbolOffsets;
	int start = relocationAddress;

	// assign addresses to segments
	for (PsxSegment& seg: file.segments)
	{
		int index = seg.id;
		size_t size = seg.data.size();
		
		relocationOffsets[index] = relocationAddress;
		relocationAddress += (int) size;

		while (relocationAddress % 4)
			relocationAddress++;
	}
	
	// parse/add/relocate symbols
	bool error = false;
	for (PsxSymbol& sym: file.symbols)
	{
		int pos;
		switch (sym.type)
		{
		case PsxSymbolType::Internal:
		case PsxSymbolType::Function:
			sym.label->setValue(relocationOffsets[sym.segment]+sym.offset);
			sym.label->setDefined(true);
			break;
		case PsxSymbolType::InternalID:
			pos = relocationOffsets[sym.segment]+sym.offset;
			sym.label->setValue(pos);
			sym.label->setDefined(true);
			symbolOffsets[sym.id] = pos;
			break;
		case PsxSymbolType::BSS:
			sym.label->setValue(relocationAddress);
			sym.label->setDefined(true);
			symbolOffsets[sym.id] = relocationAddress;
			relocationAddress += sym.size;
			
			while (relocationAddress % 4)
				relocationAddress++;
			break;
		case PsxSymbolType::External:
			if (!sym.label->isDefined())
			{
				Logger::queueError(Logger::Error, "Undefined external symbol %s in file %s",sym.name,file.name);
				error = true;
				continue;
			}
			
			symbolOffsets[sym.id] = (int) sym.label->getValue();
			break;
		}
	}

	if (error)
		return false;

	size_t dataStart = outputData.size();
	outputData.reserveBytes(relocationAddress-start);

	// load code and data
	for (PsxSegment& seg: file.segments)
	{
		// relocate
		ByteArray sectionData = seg.data;

		std::vector<RelocationAction> relocationActions;
		for (PsxRelocation& rel: seg.relocations)
		{
			RelocationData relData;
			int pos = rel.segmentOffset;
			relData.opcodeOffset = pos;
			relData.opcode = sectionData.getDoubleWord(pos);

			switch (rel.refType)
			{
			case PsxRelocationRefType::SymblId:
				relData.relocationBase = symbolOffsets[rel.referenceId]+rel.relativeOffset;
				break;
			case PsxRelocationRefType::SegmentOffset:
				relData.relocationBase = relocationOffsets[rel.referenceId] + rel.referencePos+rel.relativeOffset;
				break;
			}

			std::vector<std::string> errors;
			bool result = false;

			switch (rel.type)
			{
			case PsxRelocationType::WordLiteral:
				result = reloc->relocateOpcode(R_MIPS_32,relData, relocationActions, errors);
				break;
			case PsxRelocationType::UpperImmediate:
				result = reloc->relocateOpcode(R_MIPS_HI16,relData, relocationActions, errors);
				break;
			case PsxRelocationType::LowerImmediate:
				result = reloc->relocateOpcode(R_MIPS_LO16,relData, relocationActions, errors);
				break;
			case PsxRelocationType::FunctionCall:
				result = reloc->relocateOpcode(R_MIPS_26,relData, relocationActions, errors);
				break;
			}

			if (!result)
			{
				for (const std::string& error : errors)
				{
					Logger::queueError(Logger::Error, error);
				}
				error = true;
			}
		}

		// finish any dangling relocations
		std::vector<std::string> errors;
		if (!reloc->finish(relocationActions, errors))
		{
			for (const std::string& error : errors)
			{
				Logger::queueError(Logger::Error, error);
			}
			error = true;
		}

		// now actually write the relocated values
		for (const RelocationAction& action : relocationActions)
		{
			sectionData.replaceDoubleWord(action.offset, action.newValue);
		}

		size_t arrayStart = dataStart+relocationOffsets[seg.id]-start;
		memcpy(outputData.data(arrayStart),sectionData.data(),sectionData.size());
	}

	return !error;
}